

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::NegativeTest::testClipVertexBuildingErrors(NegativeTest *this,Functions *gl)

{
  GLchar *pGVar1;
  bool bVar2;
  RenderContext *pRVar3;
  LinkageStatus *pLVar4;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  Program program;
  Functions *gl_local;
  NegativeTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  program.m_gl._4_4_ = (*pRVar3->_vptr_RenderContext[2])();
  glu::ApiType::ApiType((ApiType *)&program.m_gl,3,1,PROFILE_CORE);
  bVar2 = glu::contextSupports((ContextType)program.m_gl._4_4_,program.m_gl._0_4_);
  pGVar1 = m_vertex_shader_code_case_0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pGVar1,&local_c9);
    pGVar1 = m_fragment_shader_code;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pGVar1,&local_101);
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_128);
    Utility::Program::Program((Program *)local_a8,gl,&local_c8,&local_100,&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pLVar4 = Utility::Program::ProgramStatus((Program *)local_a8);
    this_local._7_1_ = pLVar4->program_id == 0;
    if (!this_local._7_1_) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_2a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_2a8,
                           (char (*) [142])
                           "Functional test have failed. Building shader which statically writes to both gl_ClipVertex and gl_ClipDistances[] has unexpectedly succeeded."
                          );
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2a8);
    }
    Utility::Program::~Program((Program *)local_a8);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool gl3cts::ClipDistance::NegativeTest::testClipVertexBuildingErrors(const glw::Functions& gl)
{
	/* If OpenGL version < 3.1 is available, check that building shader program
	 fails when vertex shader statically writes to both gl_ClipVertex and
	 gl_ClipDistance[0]. Validate that the vertex shader which statically
	 writes to only the gl_ClipVertex or to the gl_ClipDistance[0] builds
	 without fail. */

	/* This test should only be executed if we're running a GL3.0 or less context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(3, 1, glu::PROFILE_CORE)))
	{
		return true;
	}

	gl3cts::ClipDistance::Utility::Program program(gl, m_vertex_shader_code_case_0, m_fragment_shader_code);

	if (program.ProgramStatus().program_id)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Functional test have failed. "
													   "Building shader which statically writes to both gl_ClipVertex "
													   "and gl_ClipDistances[] has unexpectedly succeeded."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}